

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall
cs::domain_manager::add_var_no_return<cs::var_id_const&>(domain_manager *this,var_id *name,var *val)

{
  var vVar1;
  long lVar2;
  bool bVar3;
  runtime_error *this_00;
  string *psVar4;
  string *str;
  var_id *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_fffffffffffffef8;
  runtime_error *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  domain_type *in_stack_ffffffffffffff18;
  stack_type<cs::domain_type,_std::allocator> *in_stack_ffffffffffffff40;
  string local_78 [104];
  var_id *local_10;
  
  vVar1.mDat = *(proxy **)in_RDI;
  lVar2._0_1_ = (vVar1.mDat)->is_rvalue;
  lVar2._1_1_ = (vVar1.mDat)->field_0x1;
  lVar2._2_2_ = (vVar1.mDat)->protect_level;
  lVar2._4_4_ = *(undefined4 *)&(vVar1.mDat)->field_0x4;
  local_10 = in_RSI;
  if (lVar2 == 0) {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff40);
    bVar3 = domain_type::add_var_optimal
                      (in_stack_ffffffffffffff18,
                       (var_id *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                       (var *)in_RDI,SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
    if (!bVar3) {
      str = (string *)__cxa_allocate_exception(0x28);
      psVar4 = (string *)var_id::operator_cast_to_string_(local_10);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff18,psVar4);
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff00);
      std::operator+(in_RDI,(char *)in_stack_ffffffffffffff00);
      runtime_error::runtime_error(in_stack_ffffffffffffff00,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_ffffffffffffff40);
    bVar3 = domain_type::add_var_optimal
                      (in_stack_ffffffffffffff18,
                       (var_id *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                       (var *)in_RDI,SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
    if (!bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      psVar4 = (string *)var_id::operator_cast_to_string_(local_10);
      std::__cxx11::string::string(local_78,psVar4);
      std::operator+((char *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::operator+(in_RDI,(char *)this_00);
      runtime_error::runtime_error(this_00,in_stack_fffffffffffffef8);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}